

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O3

Vec_Wrd_t * Vec_WrdStartRandom(int nSize)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *__s;
  word wVar3;
  ulong uVar4;
  
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar1 << 3);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = nSize;
  memset(__s,0,(long)nSize << 3);
  if (0 < nSize) {
    uVar4 = 0;
    do {
      wVar3 = Abc_RandomW(0);
      __s[uVar4] = wVar3;
      uVar4 = uVar4 + 1;
    } while ((uint)nSize != uVar4);
  }
  return pVVar2;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStartRandom( int nSize )
{
    Vec_Wrd_t * vSims = Vec_WrdStart( nSize ); int i;
    for ( i = 0; i < nSize; i++ )
        vSims->pArray[i] = Abc_RandomW(0);
    return vSims;
}